

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_iTXt(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  ulong local_80;
  undefined1 local_70 [8];
  ucvector decoded;
  char *transkey;
  char *langtag;
  char *key;
  uint compressed;
  uint begin;
  uint length;
  uint i;
  uint error;
  size_t chunkLength_local;
  uchar *data_local;
  LodePNGDecompressSettings *zlibsettings_local;
  LodePNGInfo *info_local;
  
  langtag = (char *)0x0;
  transkey = (char *)0x0;
  decoded.allocsize = 0;
  ucvector_init((ucvector *)local_70);
  if (chunkLength < 5) {
    length = 0x1e;
  }
  else {
    compressed = 0;
    while( true ) {
      bVar4 = false;
      if (compressed < chunkLength) {
        bVar4 = data[compressed] != '\0';
      }
      if (!bVar4) break;
      compressed = compressed + 1;
    }
    if (compressed + 3 < chunkLength) {
      if ((compressed == 0) || (0x4f < compressed)) {
        length = 0x59;
      }
      else {
        langtag = (char *)lodepng_malloc((ulong)(compressed + 1));
        if (langtag == (char *)0x0) {
          length = 0x53;
        }
        else {
          langtag[compressed] = '\0';
          for (begin = 0; begin != compressed; begin = begin + 1) {
            langtag[begin] = data[begin];
          }
          uVar1 = data[compressed + 1];
          if (data[compressed + 2] == '\0') {
            uVar2 = compressed + 3;
            compressed = 0;
            begin = uVar2;
            while( true ) {
              bVar4 = false;
              if (begin < chunkLength) {
                bVar4 = data[begin] != '\0';
              }
              if (!bVar4) break;
              compressed = compressed + 1;
              begin = begin + 1;
            }
            transkey = (char *)lodepng_malloc((ulong)(compressed + 1));
            if (transkey == (char *)0x0) {
              length = 0x53;
            }
            else {
              transkey[compressed] = '\0';
              for (begin = 0; begin != compressed; begin = begin + 1) {
                transkey[begin] = data[uVar2 + begin];
              }
              uVar2 = compressed + 1 + uVar2;
              compressed = 0;
              begin = uVar2;
              while( true ) {
                bVar4 = false;
                if (begin < chunkLength) {
                  bVar4 = data[begin] != '\0';
                }
                if (!bVar4) break;
                compressed = compressed + 1;
                begin = begin + 1;
              }
              decoded.allocsize = (size_t)lodepng_malloc((ulong)(compressed + 1));
              if ((void *)decoded.allocsize == (void *)0x0) {
                length = 0x53;
              }
              else {
                *(undefined1 *)(decoded.allocsize + compressed) = 0;
                for (begin = 0; begin != compressed; begin = begin + 1) {
                  *(uchar *)(decoded.allocsize + begin) = data[uVar2 + begin];
                }
                uVar2 = compressed + 1 + uVar2;
                if (chunkLength < uVar2) {
                  local_80 = 0;
                }
                else {
                  local_80 = chunkLength - uVar2;
                }
                if (uVar1 == '\0') {
                  uVar3 = ucvector_resize((ucvector *)local_70,(ulong)((uint)local_80 + 1));
                  if (uVar3 == 0) {
                    length = 0x53;
                    goto LAB_00119840;
                  }
                  *(uchar *)((long)local_70 + (local_80 & 0xffffffff)) = '\0';
                  for (begin = 0; begin != (uint)local_80; begin = begin + 1) {
                    *(uchar *)((long)local_70 + (ulong)begin) = data[uVar2 + begin];
                  }
                }
                else {
                  length = zlib_decompress((uchar **)local_70,(size_t *)&decoded,data + uVar2,
                                           local_80 & 0xffffffff,zlibsettings);
                  if (length != 0) goto LAB_00119840;
                  if (decoded.size < decoded.data) {
                    decoded.size = (size_t)decoded.data;
                  }
                  ucvector_push_back((ucvector *)local_70,'\0');
                }
                length = lodepng_add_itext(info,langtag,transkey,(char *)decoded.allocsize,
                                           (char *)local_70);
              }
            }
          }
          else {
            length = 0x48;
          }
        }
      }
    }
    else {
      length = 0x4b;
    }
  }
LAB_00119840:
  lodepng_free(langtag);
  lodepng_free(transkey);
  lodepng_free((void *)decoded.allocsize);
  ucvector_cleanup(local_70);
  return length;
}

Assistant:

static unsigned readChunk_iTXt(LodePNGInfo* info, const LodePNGDecompressSettings* zlibsettings,
                               const unsigned char* data, size_t chunkLength)
{
  unsigned error = 0;
  unsigned i;

  unsigned length, begin, compressed;
  char *key = 0, *langtag = 0, *transkey = 0;
  ucvector decoded;
  ucvector_init(&decoded);

  while(!error) /*not really a while loop, only used to break on error*/
  {
    /*Quick check if the chunk length isn't too small. Even without check
    it'd still fail with other error checks below if it's too short. This just gives a different error code.*/
    if(chunkLength < 5) CERROR_BREAK(error, 30); /*iTXt chunk too short*/

    /*read the key*/
    for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
    if(length + 3 >= chunkLength) CERROR_BREAK(error, 75); /*no null termination char, corrupt?*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    key[length] = 0;
    for(i = 0; i != length; ++i) key[i] = (char)data[i];

    /*read the compression method*/
    compressed = data[length + 1];
    if(data[length + 2] != 0) CERROR_BREAK(error, 72); /*the 0 byte indicating compression must be 0*/

    /*even though it's not allowed by the standard, no error is thrown if
    there's no null termination char, if the text is empty for the next 3 texts*/

    /*read the langtag*/
    begin = length + 3;
    length = 0;
    for(i = begin; i < chunkLength && data[i] != 0; ++i) ++length;

    langtag = (char*)lodepng_malloc(length + 1);
    if(!langtag) CERROR_BREAK(error, 83); /*alloc fail*/

    langtag[length] = 0;
    for(i = 0; i != length; ++i) langtag[i] = (char)data[begin + i];

    /*read the transkey*/
    begin += length + 1;
    length = 0;
    for(i = begin; i < chunkLength && data[i] != 0; ++i) ++length;

    transkey = (char*)lodepng_malloc(length + 1);
    if(!transkey) CERROR_BREAK(error, 83); /*alloc fail*/

    transkey[length] = 0;
    for(i = 0; i != length; ++i) transkey[i] = (char)data[begin + i];

    /*read the actual text*/
    begin += length + 1;

    length = chunkLength < begin ? 0 : chunkLength - begin;

    if(compressed)
    {
      /*will fail if zlib error, e.g. if length is too small*/
      error = zlib_decompress(&decoded.data, &decoded.size,
                              (unsigned char*)(&data[begin]),
                              length, zlibsettings);
      if(error) break;
      if(decoded.allocsize < decoded.size) decoded.allocsize = decoded.size;
      ucvector_push_back(&decoded, 0);
    }
    else
    {
      if(!ucvector_resize(&decoded, length + 1)) CERROR_BREAK(error, 83 /*alloc fail*/);

      decoded.data[length] = 0;
      for(i = 0; i != length; ++i) decoded.data[i] = data[begin + i];
    }

    error = lodepng_add_itext(info, key, langtag, transkey, (char*)decoded.data);

    break;
  }

  lodepng_free(key);
  lodepng_free(langtag);
  lodepng_free(transkey);
  ucvector_cleanup(&decoded);

  return error;
}